

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_lib.c
# Opt level: O0

int ossl_rsa_get0_all_params
              (RSA *r,stack_st_BIGNUM_const *primes,stack_st_BIGNUM_const *exps,
              stack_st_BIGNUM_const *coeffs)

{
  int iVar1;
  BIGNUM *pBVar2;
  RSA *in_RSI;
  RSA *in_RDI;
  int pnum;
  int i;
  RSA_PRIME_INFO *pinfo;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 local_34;
  undefined4 local_4;
  
  if (in_RDI == (RSA *)0x0) {
    local_4 = 0;
  }
  else {
    pBVar2 = RSA_get0_p(in_RDI);
    if (pBVar2 == (BIGNUM *)0x0) {
      local_4 = 1;
    }
    else {
      RSA_get0_p(in_RDI);
      sk_BIGNUM_const_push
                ((stack_st_BIGNUM_const *)in_RSI,
                 (BIGNUM *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      RSA_get0_q(in_RDI);
      sk_BIGNUM_const_push
                ((stack_st_BIGNUM_const *)in_RSI,
                 (BIGNUM *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      RSA_get0_dmp1(in_RDI);
      sk_BIGNUM_const_push
                ((stack_st_BIGNUM_const *)in_RSI,
                 (BIGNUM *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      RSA_get0_dmq1(in_RDI);
      sk_BIGNUM_const_push
                ((stack_st_BIGNUM_const *)in_RSI,
                 (BIGNUM *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      RSA_get0_iqmp(in_RDI);
      sk_BIGNUM_const_push
                ((stack_st_BIGNUM_const *)in_RSI,
                 (BIGNUM *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      iVar1 = RSA_get_multi_prime_extra_count(in_RSI);
      for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
        sk_RSA_PRIME_INFO_value((stack_st_RSA_PRIME_INFO *)in_RSI,in_stack_ffffffffffffff9c);
        sk_BIGNUM_const_push
                  ((stack_st_BIGNUM_const *)in_RSI,
                   (BIGNUM *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        sk_BIGNUM_const_push
                  ((stack_st_BIGNUM_const *)in_RSI,
                   (BIGNUM *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        sk_BIGNUM_const_push
                  ((stack_st_BIGNUM_const *)in_RSI,
                   (BIGNUM *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int ossl_rsa_get0_all_params(RSA *r, STACK_OF(BIGNUM_const) *primes,
                             STACK_OF(BIGNUM_const) *exps,
                             STACK_OF(BIGNUM_const) *coeffs)
{
#ifndef FIPS_MODULE
    RSA_PRIME_INFO *pinfo;
    int i, pnum;
#endif

    if (r == NULL)
        return 0;

    /* If |p| is NULL, there are no CRT parameters */
    if (RSA_get0_p(r) == NULL)
        return 1;

    sk_BIGNUM_const_push(primes, RSA_get0_p(r));
    sk_BIGNUM_const_push(primes, RSA_get0_q(r));
    sk_BIGNUM_const_push(exps, RSA_get0_dmp1(r));
    sk_BIGNUM_const_push(exps, RSA_get0_dmq1(r));
    sk_BIGNUM_const_push(coeffs, RSA_get0_iqmp(r));

#ifndef FIPS_MODULE
    pnum = RSA_get_multi_prime_extra_count(r);
    for (i = 0; i < pnum; i++) {
        pinfo = sk_RSA_PRIME_INFO_value(r->prime_infos, i);
        sk_BIGNUM_const_push(primes, pinfo->r);
        sk_BIGNUM_const_push(exps, pinfo->d);
        sk_BIGNUM_const_push(coeffs, pinfo->t);
    }
#endif

    return 1;
}